

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_setfenv(lua_State *L)

{
  TValue *pTVar1;
  int32_t level_00;
  undefined8 in_RAX;
  GCobj *v;
  cTValue *pcVar2;
  ulong uVar3;
  GCobj *o;
  int level;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  v = (GCobj *)lj_lib_checktab(L,2);
  if ((L->top <= L->base) ||
     (uVar3 = L->base->u64, (uVar3 & 0xffff800000000000) != 0xfffb800000000000)) {
    level_00 = lj_lib_checkint(L,1);
    uStack_28 = CONCAT44(level_00,(undefined4)uStack_28);
    if (level_00 == 0) {
      (L->env).gcptr64 = (uint64_t)v;
      return 0;
    }
    pcVar2 = lj_debug_frame(L,level_00,(int *)((long)&uStack_28 + 4));
    if (pcVar2 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
    uVar3 = pcVar2[-1].u64;
  }
  o = (GCobj *)(uVar3 & 0x7fffffffffff);
  if ((o->gch).unused1 == '\0') {
    *(GCobj **)&(o->str).hash = v;
    if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(L->glref).ptr64,o,v);
    }
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = (ulong)o | 0xfffb800000000000;
    return 1;
  }
  lj_err_caller(L,LJ_ERR_SETFENV);
}

Assistant:

LJLIB_CF(setfenv)
{
  GCfunc *fn;
  GCtab *t = lj_lib_checktab(L, 2);
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_checkint(L, 1);
    if (level == 0) {
      /* NOBARRIER: A thread (i.e. L) is never black. */
      setgcref(L->env, obj2gco(t));
      return 0;
    }
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    if (LJ_FR2) o--;
  }
  fn = &gcval(o)->fn;
  if (!isluafunc(fn))
    lj_err_caller(L, LJ_ERR_SETFENV);
  setgcref(fn->l.env, obj2gco(t));
  lj_gc_objbarrier(L, obj2gco(fn), t);
  setfuncV(L, L->top++, fn);
  return 1;
}